

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O3

pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
* __thiscall
AddrManImpl::Select_
          (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
           *__return_storage_ptr__,AddrManImpl *this,bool new_only,
          unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
          *networks)

{
  FastRandomContext *this_00;
  nid_type (*panVar1) [64];
  undefined8 uVar2;
  uint uVar3;
  ServiceFlags SVar4;
  bool bVar5;
  bool bVar6;
  const_iterator cVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  const_iterator cVar10;
  const_iterator cVar11;
  time_point tVar12;
  Logger *this_01;
  ulong uVar13;
  int bits;
  _Hash_node_base *p_Var14;
  uint64_t maxval;
  long lVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  long in_FS_OFFSET;
  double dVar19;
  undefined1 auVar20 [16];
  string_view source_file;
  string_view logging_function;
  double local_a8;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  *__range2;
  char *local_68;
  nid_type node_id;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if ((networks->_M_h)._M_element_count == 0) {
      lVar15 = (long)this->nNew;
      lVar18 = (long)this->nTried;
    }
    else {
      p_Var14 = (networks->_M_h)._M_before_begin._M_nxt;
      if (p_Var14 == (_Hash_node_base *)0x0) {
        lVar18 = 0;
        lVar15 = 0;
      }
      else {
        lVar15 = 0;
        lVar18 = 0;
        do {
          cVar7 = std::
                  _Hashtable<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&(this->m_network_counts)._M_h,(key_type *)(p_Var14 + 1));
          if (cVar7.
              super__Node_iterator_base<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false>
              ._M_cur != (__node_type *)0x0) {
            lVar15 = lVar15 + *(long *)((long)cVar7.
                                              super__Node_iterator_base<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false>
                                              ._M_cur + 0x10);
            lVar18 = lVar18 + *(long *)((long)cVar7.
                                              super__Node_iterator_base<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false>
                                              ._M_cur + 0x18);
          }
          p_Var14 = p_Var14->_M_nxt;
        } while (p_Var14 != (_Hash_node_base *)0x0);
      }
    }
    if (((!new_only) || (lVar15 != 0)) && (lVar15 + lVar18 != 0)) {
      bVar5 = !new_only && lVar18 != 0;
      if ((!new_only && lVar18 != 0) && (lVar15 != 0)) {
        uVar8 = RandomMixin<FastRandomContext>::randbits<1>
                          (&(this->insecure_rand).super_RandomMixin<FastRandomContext>);
        bVar5 = uVar8 != 0;
      }
      this_00 = &this->insecure_rand;
      uVar16 = 0x3ff;
      if (bVar5) {
        uVar16 = 0xff;
      }
      uVar3 = 0x1f;
      if ((uint)uVar16 != 0) {
        for (; (uint)uVar16 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      local_a8 = 1.0;
      do {
        do {
          uVar8 = RandomMixin<FastRandomContext>::randbits
                            (&this_00->super_RandomMixin<FastRandomContext>,
                             (uVar3 ^ 0xffffffe0) + 0x21);
        } while (uVar16 < uVar8);
        do {
          uVar9 = RandomMixin<FastRandomContext>::randbits
                            (&this_00->super_RandomMixin<FastRandomContext>,6);
        } while (0x3f < uVar9);
        uVar13 = (ulong)(int)uVar8;
        iVar17 = 0;
        do {
          if (bVar5) {
            panVar1 = this->vvTried;
            if (uVar13 < 0x100) {
LAB_0084c461:
              node_id = panVar1[uVar13][(int)uVar9 + iVar17 & 0x3f];
              if (node_id != -1) {
                if ((networks->_M_h)._M_element_count == 0) {
LAB_0084c4df:
                  cVar10 = std::
                           _Hashtable<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find(&(this->mapInfo)._M_h,&node_id);
                  if (cVar10.super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>.
                      _M_cur == (__node_type *)0x0) {
                    __assert_fail("it_found != mapInfo.end()",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                                  ,0x30d,
                                  "std::pair<CAddress, NodeSeconds> AddrManImpl::Select_(bool, const std::unordered_set<Network> &) const"
                                 );
                  }
                  uVar8 = RandomMixin<FastRandomContext>::randbits<30>
                                    (&this_00->super_RandomMixin<FastRandomContext>);
                  auVar20._8_4_ = (int)(uVar8 >> 0x20);
                  auVar20._0_8_ = uVar8;
                  auVar20._12_4_ = 0x45300000;
                  tVar12 = NodeClock::now();
                  lVar15 = *(long *)((long)cVar10.
                                           super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>
                                           ._M_cur + 0x48);
                  iVar17 = *(int *)((long)cVar10.
                                          super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>
                                          ._M_cur + 0x80);
                  if (7 < iVar17) {
                    iVar17 = 8;
                  }
                  dVar19 = pow(0.66,(double)iVar17);
                  if ((auVar20._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0) <
                      dVar19 * *(double *)
                                (&DAT_00f6cbc0 +
                                (ulong)((long)tVar12.__d.__r / 1000000000 - lVar15 < 600) * 8) *
                      local_a8 * 1073741824.0) {
                    this_01 = LogInstance();
                    bVar6 = BCLog::Logger::WillLogCategoryLevel(this_01,ADDRMAN,Debug);
                    if (bVar6) {
                      CService::ToStringAddrPort_abi_cxx11_
                                (&local_58,
                                 (CService *)
                                 ((long)cVar10.
                                        super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>
                                        ._M_cur + 0x10));
                      local_68 = "new";
                      if (bVar5) {
                        local_68 = "tried";
                      }
                      source_file._M_str =
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                      ;
                      source_file._M_len = 0x5b;
                      logging_function._M_str = "Select_";
                      logging_function._M_len = 7;
                      LogPrintFormatInternal<std::__cxx11::string,char_const*>
                                (logging_function,source_file,0x312,ADDRMAN,Debug,
                                 (ConstevalFormatString<2U>)0xf6d000,&local_58,&local_68);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_58._M_dataplus._M_p._4_4_,
                                      (Network)local_58._M_dataplus._M_p) != &local_58.field_2) {
                        operator_delete((undefined1 *)
                                        CONCAT44(local_58._M_dataplus._M_p._4_4_,
                                                 (Network)local_58._M_dataplus._M_p),
                                        local_58.field_2._M_allocated_capacity + 1);
                      }
                    }
                    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                               __return_storage_ptr__,
                               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                               ((long)cVar10.
                                      super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>
                                      ._M_cur + 0x10));
                    uVar2 = *(undefined8 *)
                             ((long)cVar10.
                                    super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>
                                    ._M_cur + 0x28);
                    (__return_storage_ptr__->first).super_CService.super_CNetAddr.m_net = (int)uVar2
                    ;
                    (__return_storage_ptr__->first).super_CService.super_CNetAddr.m_scope_id =
                         (int)((ulong)uVar2 >> 0x20);
                    (__return_storage_ptr__->first).super_CService.port =
                         *(uint16_t *)
                          ((long)cVar10.
                                 super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>.
                                 _M_cur + 0x30);
                    SVar4 = *(ServiceFlags *)
                             ((long)cVar10.
                                    super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>
                                    ._M_cur + 0x40);
                    (__return_storage_ptr__->first).nTime.__d.__r =
                         *(rep *)((long)cVar10.
                                        super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>
                                        ._M_cur + 0x38);
                    (__return_storage_ptr__->first).nServices = SVar4;
                    (__return_storage_ptr__->second).__d.__r =
                         *(rep *)((long)cVar10.
                                        super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>
                                        ._M_cur + 0x48);
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      return __return_storage_ptr__;
                    }
                    goto LAB_0084c714;
                  }
                  local_a8 = local_a8 * 1.2;
                  break;
                }
                cVar10 = std::
                         _Hashtable<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find(&(this->mapInfo)._M_h,&node_id);
                if (cVar10.super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>._M_cur
                    != (__node_type *)0x0) {
                  local_58._M_dataplus._M_p._0_4_ =
                       CNetAddr::GetNetwork
                                 ((CNetAddr *)
                                  ((long)cVar10.
                                         super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>
                                         ._M_cur + 0x10));
                  cVar11 = std::
                           _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           ::find(&networks->_M_h,(key_type *)&local_58);
                  if (cVar11.super__Node_iterator_base<Network,_false>._M_cur != (__node_type *)0x0)
                  goto LAB_0084c4df;
                }
              }
            }
          }
          else {
            panVar1 = this->vvNew;
            if (uVar13 < 0x400) goto LAB_0084c461;
          }
          iVar17 = iVar17 + 1;
        } while (iVar17 != 0x40);
      } while( true );
    }
  }
  CService::CService((CService *)__return_storage_ptr__);
  (__return_storage_ptr__->first).nTime.__d.__r = 100000000;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    (__return_storage_ptr__->first).nServices = NODE_NONE;
    (__return_storage_ptr__->second).__d.__r = 0;
    return __return_storage_ptr__;
  }
LAB_0084c714:
  __stack_chk_fail();
}

Assistant:

std::pair<CAddress, NodeSeconds> AddrManImpl::Select_(bool new_only, const std::unordered_set<Network>& networks) const
{
    AssertLockHeld(cs);

    if (vRandom.empty()) return {};

    size_t new_count = nNew;
    size_t tried_count = nTried;

    if (!networks.empty()) {
        new_count = 0;
        tried_count = 0;
        for (auto& network : networks) {
            auto it = m_network_counts.find(network);
            if (it == m_network_counts.end()) {
                continue;
            }
            auto counts = it->second;
            new_count += counts.n_new;
            tried_count += counts.n_tried;
        }
    }

    if (new_only && new_count == 0) return {};
    if (new_count + tried_count == 0) return {};

    // Decide if we are going to search the new or tried table
    // If either option is viable, use a 50% chance to choose
    bool search_tried;
    if (new_only || tried_count == 0) {
        search_tried = false;
    } else if (new_count == 0) {
        search_tried = true;
    } else {
        search_tried = insecure_rand.randbool();
    }

    const int bucket_count{search_tried ? ADDRMAN_TRIED_BUCKET_COUNT : ADDRMAN_NEW_BUCKET_COUNT};

    // Loop through the addrman table until we find an appropriate entry
    double chance_factor = 1.0;
    while (1) {
        // Pick a bucket, and an initial position in that bucket.
        int bucket = insecure_rand.randrange(bucket_count);
        int initial_position = insecure_rand.randrange(ADDRMAN_BUCKET_SIZE);

        // Iterate over the positions of that bucket, starting at the initial one,
        // and looping around.
        int i, position;
        nid_type node_id;
        for (i = 0; i < ADDRMAN_BUCKET_SIZE; ++i) {
            position = (initial_position + i) % ADDRMAN_BUCKET_SIZE;
            node_id = GetEntry(search_tried, bucket, position);
            if (node_id != -1) {
                if (!networks.empty()) {
                    const auto it{mapInfo.find(node_id)};
                    if (Assume(it != mapInfo.end()) && networks.contains(it->second.GetNetwork())) break;
                } else {
                    break;
                }
            }
        }

        // If the bucket is entirely empty, start over with a (likely) different one.
        if (i == ADDRMAN_BUCKET_SIZE) continue;

        // Find the entry to return.
        const auto it_found{mapInfo.find(node_id)};
        assert(it_found != mapInfo.end());
        const AddrInfo& info{it_found->second};

        // With probability GetChance() * chance_factor, return the entry.
        if (insecure_rand.randbits<30>() < chance_factor * info.GetChance() * (1 << 30)) {
            LogDebug(BCLog::ADDRMAN, "Selected %s from %s\n", info.ToStringAddrPort(), search_tried ? "tried" : "new");
            return {info, info.m_last_try};
        }

        // Otherwise start over with a (likely) different bucket, and increased chance factor.
        chance_factor *= 1.2;
    }
}